

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_Destructor(node *Node)

{
  nodecontext *p_00;
  nodeclass *Class_00;
  nodecontext *p;
  nodeclass *Class;
  node *Node_local;
  
  if ((Node != (node *)0x0) && (Node->VMT != (void *)0x0)) {
    Class_00 = (nodeclass *)((long)Node->VMT + -0x48);
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x348,"void Node_Destructor(node *)");
    }
    p_00 = *Node->VMT;
    Node_Notify(Node,0xb);
    CallDelete(p_00,Node,Class_00);
    Node->Magic = 0;
    UnlockModules(Class_00);
  }
  return;
}

Assistant:

void Node_Destructor(node* Node)
{
    if (Node && Node->VMT)
    {
        const nodeclass* Class = NodeGetClass(Node);
        nodecontext* p = Node_Context(Node);

        Node_Notify(Node,NODE_DELETING);

        CallDelete(p,Node,Class);

#ifdef CONFIG_DEBUGCHECKS
        Node->Magic = 0;
#endif

        UnlockModules(Class);
    }
}